

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSObjectFactory::buildChoiceSequenceParticles
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSParticleList *particleList,
          XSModel *xsModel)

{
  NodeTypes NVar1;
  XSParticle *toAdd;
  
  while( true ) {
    if (rootNode == (ContentSpecNode *)0x0) {
      return;
    }
    NVar1 = rootNode->fType;
    if ((NVar1 & ~ZeroOrOne) != Choice) break;
    buildChoiceSequenceParticles(this,rootNode->fFirst,particleList,xsModel);
    rootNode = rootNode->fSecond;
  }
  if (((NVar1 & (Any_NS|Any)) == Any) ||
     (NVar1 == Any_NS_Choice || (NVar1 & (Any_NS|Any_Other)) == Any_NS)) {
    toAdd = createWildcardParticle(this,rootNode,xsModel);
  }
  else if (NVar1 == Leaf) {
    toAdd = createElementParticle(this,rootNode,xsModel);
  }
  else {
    toAdd = createModelGroupParticle(this,rootNode,xsModel);
  }
  if (toAdd == (XSParticle *)0x0) {
    return;
  }
  BaseRefVectorOf<xercesc_4_0::XSParticle>::addElement
            (&particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>,toAdd);
  return;
}

Assistant:

void XSObjectFactory::buildChoiceSequenceParticles(const ContentSpecNode* const rootNode,
                                            XSParticleList* const particleList,
                                            XSModel* const xsModel)
{
    if (rootNode)
    {
        const ContentSpecNode::NodeTypes nodeType = rootNode->getType();

        if (nodeType == ContentSpecNode::Sequence)
        {
            buildChoiceSequenceParticles(rootNode->getFirst(), particleList, xsModel);
            buildChoiceSequenceParticles(rootNode->getSecond(), particleList, xsModel);
        }
        else if (nodeType == ContentSpecNode::Choice)
        {
            buildChoiceSequenceParticles(rootNode->getFirst(), particleList, xsModel);
            buildChoiceSequenceParticles(rootNode->getSecond(), particleList, xsModel);
        }
        else if ((nodeType & 0x0f) == ContentSpecNode::Any
                 || (nodeType & 0x0f) == ContentSpecNode::Any_Other
                 || (nodeType & 0x0f) == ContentSpecNode::Any_NS
                 || nodeType == ContentSpecNode::Any_NS_Choice)
        {
            XSParticle* wildcardParticle = createWildcardParticle(rootNode, xsModel);
            if (wildcardParticle)
                particleList->addElement(wildcardParticle);
        }
        else if (nodeType == ContentSpecNode::Leaf)
        {
            XSParticle* elemParticle = createElementParticle(rootNode, xsModel);
            if (elemParticle)
                particleList->addElement(elemParticle);
        }
        // must be a model group
        else
        {
            XSParticle* xsParticle = createModelGroupParticle(rootNode, xsModel);
            if (xsParticle)
                particleList->addElement(xsParticle);
        }
    }
}